

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_b9a119::HandleImportedRuntimeArtifactsMode
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  cmInstallCommandArguments *typeArgs;
  undefined8 uVar1;
  cmExecutionStatus *pcVar2;
  bool bVar3;
  int iVar4;
  TargetType TVar5;
  cmArgumentParser<(anonymous_namespace)::HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
  *pcVar6;
  cmArgumentParser<ArgVectors> *pcVar7;
  cmArgumentParser<void> *this_01;
  reference str;
  ulong uVar8;
  string *psVar9;
  reference ppcVar10;
  pointer pcVar11;
  cmGlobalGenerator *pcVar12;
  static_string_view sVar13;
  bool local_139c;
  bool local_139b;
  bool local_139a;
  bool local_1399;
  bool local_124f;
  bool local_124d;
  bool local_124b;
  bool local_1249;
  unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> local_11a8;
  unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> local_11a0;
  unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> local_1198;
  unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> local_1190;
  string local_1188;
  undefined1 local_1168 [16];
  undefined1 local_1158 [56];
  cmAlphaNum local_1120;
  string local_10f0;
  string local_10d0;
  undefined1 local_10b0 [8];
  string local_10a8;
  undefined1 local_1088 [16];
  cmAlphaNum local_1078;
  cmAlphaNum local_1048;
  string local_1018;
  string local_ff8;
  undefined1 local_fd8 [8];
  unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,_std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>_>
  local_fd0;
  unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,_std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>_>
  bundleGenerator;
  unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,_std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>_>
  frameworkGenerator;
  unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,_std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>_>
  runtimeGenerator;
  unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,_std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>_>
  libraryGenerator;
  cmTarget *target_1;
  cmTarget *ti;
  iterator __end1_1;
  iterator __begin1_1;
  vector<cmTarget_*,_std::allocator<cmTarget_*>_> *__range1_1;
  anon_class_48_1_585e00ec createInstallGenerator;
  undefined1 local_f50 [4];
  bool installsBundle;
  bool installsFramework;
  bool installsRuntime;
  bool installsLibrary;
  cmAlphaNum local_f20;
  string local_ef0;
  cmAlphaNum local_ed0;
  cmAlphaNum local_ea0;
  string local_e70;
  cmTarget *local_e50;
  cmTarget *global_target;
  cmTarget *target;
  cmAlphaNum local_e10;
  string local_de0;
  string *local_dc0;
  string *tgt;
  iterator __end1;
  iterator __begin1;
  MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  cmAlphaNum local_d98;
  cmAlphaNum local_d68;
  string local_d38;
  allocator<char> local_d11;
  string local_d10;
  undefined1 local_cf0 [8];
  string system;
  cmInstallRuntimeDependencySet *runtimeDependencySet;
  cmAlphaNum local_cc0;
  cmAlphaNum local_c90;
  string local_c60;
  ParseResult local_c40;
  ParseResult local_c10;
  ParseResult local_be0;
  ParseResult local_bb0;
  string local_b80;
  undefined1 local_b60 [8];
  cmInstallCommandArguments bundleArgs;
  undefined1 local_988 [8];
  cmInstallCommandArguments frameworkArgs;
  undefined1 local_7b0 [8];
  cmInstallCommandArguments runtimeArgs;
  undefined1 local_5d8 [8];
  cmInstallCommandArguments libraryArgs;
  undefined1 local_418 [7];
  bool success;
  string_view local_3e8;
  string_view local_3d8;
  string local_3c8;
  undefined1 local_3a8 [8];
  cmInstallCommandArguments genericArgs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  string runtimeDependencySetArg;
  MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  targetList;
  ArgVectors argVectors;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  genericArgVector;
  cmArgumentParser<ArgVectors> local_d8;
  undefined1 local_68 [8];
  vector<cmTarget_*,_std::allocator<cmTarget_*>_> targets;
  Helper helper;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  helper.DefaultComponentName.field_2._8_8_ = status;
  Helper::Helper((Helper *)
                 &targets.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,status);
  std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::vector
            ((vector<cmTarget_*,_std::allocator<cmTarget_*>_> *)local_68);
  if (((anonymous_namespace)::
       HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::argHelper == '\0') &&
     (iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::argHelper), iVar4 != 0)) {
    local_d8.super_Base.Bindings.Positions.
    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.super_Base.Bindings.Positions.
    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d8.super_Base.Bindings.ParsedKeyword._M_invoker = (_Invoker_type)0x0;
    local_d8.super_Base.Bindings.Positions.
    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._8_8_ = 0;
    local_d8.super_Base.Bindings.ParsedKeyword.super__Function_base._M_manager = (_Manager_type)0x0;
    local_d8.super_Base.Bindings.KeywordMissingValue._M_invoker = (_Invoker_type)0x0;
    local_d8.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._M_unused._M_object =
         (void *)0x0;
    local_d8.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._8_8_ = 0;
    local_d8.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_manager =
         (_Manager_type)0x0;
    local_d8.super_Base.Bindings.Keywords.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d8.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._M_unused.
    _M_object = (void *)0x0;
    local_d8.super_Base.Bindings.Keywords.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.super_Base.Bindings.Keywords.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cmArgumentParser<ArgVectors>::cmArgumentParser(&local_d8);
    sVar13 = ::cm::operator____s("LIBRARY",7);
    pcVar6 = (cmArgumentParser<(anonymous_namespace)::HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
              *)cmArgumentParser<(anonymous_namespace)::HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
                ::
                Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          ((cmArgumentParser<(anonymous_namespace)::HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
                            *)&local_d8,sVar13,0);
    sVar13 = ::cm::operator____s("RUNTIME",7);
    pcVar6 = (cmArgumentParser<(anonymous_namespace)::HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
              *)cmArgumentParser<(anonymous_namespace)::HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
                ::
                Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          (pcVar6,sVar13,0x18);
    sVar13 = ::cm::operator____s("FRAMEWORK",9);
    pcVar6 = (cmArgumentParser<(anonymous_namespace)::HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
              *)cmArgumentParser<(anonymous_namespace)::HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
                ::
                Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          (pcVar6,sVar13,0x30);
    sVar13 = ::cm::operator____s("BUNDLE",6);
    pcVar7 = cmArgumentParser<(anonymous_namespace)::HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
             ::
             Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                       (pcVar6,sVar13,0x48);
    cmArgumentParser<ArgVectors>::cmArgumentParser
              (&HandleImportedRuntimeArtifactsMode::argHelper,pcVar7);
    cmArgumentParser<ArgVectors>::~cmArgumentParser(&local_d8);
    __cxa_atexit(cmArgumentParser<ArgVectors>::~cmArgumentParser,
                 &HandleImportedRuntimeArtifactsMode::argHelper,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::argHelper);
  }
  this = &argVectors.Bundle.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this);
  cmArgumentParser<(anonymous_namespace)::HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
  ::Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((ArgVectors *)
             &targetList.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (cmArgumentParser<(anonymous_namespace)::HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
              *)&HandleImportedRuntimeArtifactsMode::argHelper,args,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this,0);
  ArgumentParser::
  MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::MaybeEmpty((MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)((long)&runtimeDependencySetArg.field_2 + 8));
  std::__cxx11::string::string
            ((string *)
             &unknownArgs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&genericArgs.DefaultComponentName.field_2 + 8));
  std::__cxx11::string::string((string *)&local_3c8,(string *)&helper.Makefile);
  cmInstallCommandArguments::cmInstallCommandArguments
            ((cmInstallCommandArguments *)local_3a8,&local_3c8);
  std::__cxx11::string::~string((string *)&local_3c8);
  local_3d8 = (string_view)::cm::operator____s("IMPORTED_RUNTIME_ARTIFACTS",0x1a);
  this_01 = cmArgumentParser<void>::
            Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      ((cmArgumentParser<void> *)local_3a8,(static_string_view)local_3d8,
                       (MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&runtimeDependencySetArg.field_2 + 8));
  local_3e8 = (string_view)::cm::operator____s("RUNTIME_DEPENDENCY_SET",0x16);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (this_01,(static_string_view)local_3e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &unknownArgs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cmArgumentParser<void>::
  Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((ParseResult *)local_418,(cmArgumentParser<void> *)local_3a8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&argVectors.Bundle.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&genericArgs.DefaultComponentName.field_2 + 8),0);
  ArgumentParser::ParseResult::~ParseResult((ParseResult *)local_418);
  libraryArgs.DefaultComponentName.field_2._M_local_buf[0xf] =
       cmInstallCommandArguments::Finalize((cmInstallCommandArguments *)local_3a8);
  std::__cxx11::string::string
            ((string *)(runtimeArgs.DefaultComponentName.field_2._M_local_buf + 8),
             (string *)&helper.Makefile);
  cmInstallCommandArguments::cmInstallCommandArguments
            ((cmInstallCommandArguments *)local_5d8,
             (string *)((long)&runtimeArgs.DefaultComponentName.field_2 + 8));
  std::__cxx11::string::~string
            ((string *)(runtimeArgs.DefaultComponentName.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)(frameworkArgs.DefaultComponentName.field_2._M_local_buf + 8),
             (string *)&helper.Makefile);
  cmInstallCommandArguments::cmInstallCommandArguments
            ((cmInstallCommandArguments *)local_7b0,
             (string *)((long)&frameworkArgs.DefaultComponentName.field_2 + 8));
  std::__cxx11::string::~string
            ((string *)(frameworkArgs.DefaultComponentName.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)(bundleArgs.DefaultComponentName.field_2._M_local_buf + 8),
             (string *)&helper.Makefile);
  cmInstallCommandArguments::cmInstallCommandArguments
            ((cmInstallCommandArguments *)local_988,
             (string *)((long)&bundleArgs.DefaultComponentName.field_2 + 8));
  std::__cxx11::string::~string
            ((string *)(bundleArgs.DefaultComponentName.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_b80,(string *)&helper.Makefile);
  cmInstallCommandArguments::cmInstallCommandArguments
            ((cmInstallCommandArguments *)local_b60,&local_b80);
  std::__cxx11::string::~string((string *)&local_b80);
  cmArgumentParser<void>::
  Parse<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (&local_bb0,(cmArgumentParser<void> *)local_5d8,
             (MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&targetList.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&genericArgs.DefaultComponentName.field_2 + 8),0);
  ArgumentParser::ParseResult::~ParseResult(&local_bb0);
  cmArgumentParser<void>::
  Parse<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (&local_be0,(cmArgumentParser<void> *)local_7b0,
             (MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&argVectors.Library.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&genericArgs.DefaultComponentName.field_2 + 8),0);
  ArgumentParser::ParseResult::~ParseResult(&local_be0);
  cmArgumentParser<void>::
  Parse<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (&local_c10,(cmArgumentParser<void> *)local_988,
             (MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&argVectors.Runtime.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&genericArgs.DefaultComponentName.field_2 + 8),0);
  ArgumentParser::ParseResult::~ParseResult(&local_c10);
  cmArgumentParser<void>::
  Parse<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (&local_c40,(cmArgumentParser<void> *)local_b60,
             (MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&argVectors.Framework.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&genericArgs.DefaultComponentName.field_2 + 8),0);
  ArgumentParser::ParseResult::~ParseResult(&local_c40);
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&genericArgs.DefaultComponentName.field_2 + 8));
  uVar1 = helper.DefaultComponentName.field_2._8_8_;
  if (bVar3) {
    cmInstallCommandArguments::SetGenericArguments
              ((cmInstallCommandArguments *)local_5d8,(cmInstallCommandArguments *)local_3a8);
    cmInstallCommandArguments::SetGenericArguments
              ((cmInstallCommandArguments *)local_7b0,(cmInstallCommandArguments *)local_3a8);
    cmInstallCommandArguments::SetGenericArguments
              ((cmInstallCommandArguments *)local_988,(cmInstallCommandArguments *)local_3a8);
    cmInstallCommandArguments::SetGenericArguments
              ((cmInstallCommandArguments *)local_b60,(cmInstallCommandArguments *)local_3a8);
    local_1249 = false;
    if ((libraryArgs.DefaultComponentName.field_2._M_local_buf[0xf] & 1U) != 0) {
      local_1249 = cmInstallCommandArguments::Finalize((cmInstallCommandArguments *)local_5d8);
    }
    libraryArgs.DefaultComponentName.field_2._M_local_buf[0xf] = local_1249;
    local_124b = false;
    if (local_1249 != false) {
      local_124b = cmInstallCommandArguments::Finalize((cmInstallCommandArguments *)local_7b0);
    }
    libraryArgs.DefaultComponentName.field_2._M_local_buf[0xf] = local_124b;
    local_124d = false;
    if (local_124b != false) {
      local_124d = cmInstallCommandArguments::Finalize((cmInstallCommandArguments *)local_988);
    }
    libraryArgs.DefaultComponentName.field_2._M_local_buf[0xf] = local_124d;
    local_124f = false;
    if (local_124d != false) {
      local_124f = cmInstallCommandArguments::Finalize((cmInstallCommandArguments *)local_b60);
    }
    libraryArgs.DefaultComponentName.field_2._M_local_buf[0xf] = local_124f;
    if (local_124f == false) {
      args_local._7_1_ = 0;
    }
    else {
      system.field_2._8_8_ = 0;
      uVar8 = std::__cxx11::string::empty();
      pcVar2 = helper.Status;
      if ((uVar8 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d10,"CMAKE_HOST_SYSTEM_NAME",&local_d11);
        psVar9 = cmMakefile::GetSafeDefinition((cmMakefile *)pcVar2,&local_d10);
        std::__cxx11::string::string((string *)local_cf0,(string *)psVar9);
        std::__cxx11::string::~string((string *)&local_d10);
        std::allocator<char>::~allocator(&local_d11);
        bVar3 = cmRuntimeDependencyArchive::PlatformSupportsRuntimeDependencies((string *)local_cf0)
        ;
        uVar1 = helper.DefaultComponentName.field_2._8_8_;
        if (bVar3) {
          pcVar12 = cmMakefile::GetGlobalGenerator((cmMakefile *)helper.Status);
          system.field_2._8_8_ =
               cmGlobalGenerator::GetNamedRuntimeDependencySet
                         (pcVar12,(string *)
                                  &unknownArgs.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else {
          cmAlphaNum::cmAlphaNum
                    (&local_d68,
                     "IMPORTED_RUNTIME_ARTIFACTS RUNTIME_DEPENDENCY_SET is not supported on system \""
                    );
          cmAlphaNum::cmAlphaNum(&local_d98,(string *)local_cf0);
          __range1._7_1_ = 0x22;
          cmStrCat<char>(&local_d38,&local_d68,&local_d98,(char *)((long)&__range1 + 7));
          cmExecutionStatus::SetError((cmExecutionStatus *)uVar1,&local_d38);
          std::__cxx11::string::~string((string *)&local_d38);
          args_local._7_1_ = 0;
        }
        std::__cxx11::string::~string((string *)local_cf0);
        if (!bVar3) goto LAB_00618864;
      }
      bVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&runtimeDependencySetArg.field_2 + 8));
      if (bVar3) {
        args_local._7_1_ = 1;
      }
      else {
        this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&runtimeDependencySetArg.field_2 + 8);
        __end1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(this_00);
        tgt = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(this_00);
        while( true ) {
          bVar3 = __gnu_cxx::operator!=
                            (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)&tgt);
          if (!bVar3) break;
          local_dc0 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&__end1);
          bVar3 = cmMakefile::IsAlias((cmMakefile *)helper.Status,local_dc0);
          uVar1 = helper.DefaultComponentName.field_2._8_8_;
          if (bVar3) {
            cmAlphaNum::cmAlphaNum(&local_e10,"IMPORTED_RUNTIME_ARTIFACTS given target \"");
            cmAlphaNum::cmAlphaNum((cmAlphaNum *)&target,local_dc0);
            cmStrCat<char[21]>(&local_de0,&local_e10,(cmAlphaNum *)&target,
                               (char (*) [21])"\" which is an alias.");
            cmExecutionStatus::SetError((cmExecutionStatus *)uVar1,&local_de0);
            std::__cxx11::string::~string((string *)&local_de0);
            args_local._7_1_ = 0;
            goto LAB_00618864;
          }
          global_target = cmMakefile::FindTargetToUse((cmMakefile *)helper.Status,local_dc0,false);
          if (global_target == (cmTarget *)0x0) {
LAB_0061791a:
            pcVar12 = cmMakefile::GetGlobalGenerator((cmMakefile *)helper.Status);
            local_e50 = cmGlobalGenerator::FindTarget(pcVar12,local_dc0,true);
            if (local_e50 != (cmTarget *)0x0) {
              bVar3 = cmTarget::IsImported(local_e50);
              if (bVar3) {
                global_target = local_e50;
              }
            }
          }
          else {
            bVar3 = cmTarget::IsImported(global_target);
            if (!bVar3) goto LAB_0061791a;
          }
          uVar1 = helper.DefaultComponentName.field_2._8_8_;
          if (global_target == (cmTarget *)0x0) {
            cmAlphaNum::cmAlphaNum(&local_f20,"IMPORTED_RUNTIME_ARTIFACTS given target \"");
            cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_f50,local_dc0);
            cmStrCat<char[24]>(&local_ef0,&local_f20,(cmAlphaNum *)local_f50,
                               (char (*) [24])"\" which does not exist.");
            cmExecutionStatus::SetError((cmExecutionStatus *)uVar1,&local_ef0);
            std::__cxx11::string::~string((string *)&local_ef0);
            args_local._7_1_ = 0;
            goto LAB_00618864;
          }
          TVar5 = cmTarget::GetType(global_target);
          if (TVar5 != EXECUTABLE) {
            TVar5 = cmTarget::GetType(global_target);
            if (TVar5 != SHARED_LIBRARY) {
              TVar5 = cmTarget::GetType(global_target);
              uVar1 = helper.DefaultComponentName.field_2._8_8_;
              if (TVar5 != MODULE_LIBRARY) {
                cmAlphaNum::cmAlphaNum(&local_ea0,"IMPORTED_RUNTIME_ARTIFACTS given target \"");
                cmAlphaNum::cmAlphaNum(&local_ed0,local_dc0);
                cmStrCat<char[50]>(&local_e70,&local_ea0,&local_ed0,
                                   (char (*) [50])
                                   "\" which is not an executable, library, or module.");
                cmExecutionStatus::SetError((cmExecutionStatus *)uVar1,&local_e70);
                std::__cxx11::string::~string((string *)&local_e70);
                args_local._7_1_ = 0;
                goto LAB_00618864;
              }
            }
          }
          std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::push_back
                    ((vector<cmTarget_*,_std::allocator<cmTarget_*>_> *)local_68,&global_target);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end1);
        }
        createInstallGenerator.helper.DefaultComponentName.field_2._M_local_buf[0xf] = '\0';
        createInstallGenerator.helper.DefaultComponentName.field_2._M_local_buf[0xe] = '\0';
        createInstallGenerator.helper.DefaultComponentName.field_2._M_local_buf[0xd] = '\0';
        createInstallGenerator.helper.DefaultComponentName.field_2._M_local_buf[0xc] = '\0';
        Helper::Helper((Helper *)&__range1_1,
                       (Helper *)
                       &targets.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
        __end1_1 = std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::begin
                             ((vector<cmTarget_*,_std::allocator<cmTarget_*>_> *)local_68);
        ti = (cmTarget *)
             std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::end
                       ((vector<cmTarget_*,_std::allocator<cmTarget_*>_> *)local_68);
        while( true ) {
          bVar3 = __gnu_cxx::operator!=
                            (&__end1_1,
                             (__normal_iterator<cmTarget_**,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_>
                              *)&ti);
          if (!bVar3) break;
          ppcVar10 = __gnu_cxx::
                     __normal_iterator<cmTarget_**,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_>
                     ::operator*(&__end1_1);
          typeArgs = (cmInstallCommandArguments *)*ppcVar10;
          std::
          unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>>
          ::unique_ptr<std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>,void>
                    ((unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>>
                      *)&runtimeGenerator);
          std::
          unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>>
          ::unique_ptr<std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>,void>
                    ((unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>>
                      *)&frameworkGenerator);
          std::
          unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>>
          ::unique_ptr<std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>,void>
                    ((unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>>
                      *)&bundleGenerator);
          std::
          unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>>
          ::unique_ptr<std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>,void>
                    ((unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>>
                      *)&local_fd0);
          TVar5 = cmTarget::GetType((cmTarget *)typeArgs);
          if (TVar5 == EXECUTABLE) {
            bVar3 = cmTarget::IsAppBundleOnApple((cmTarget *)typeArgs);
            if (!bVar3) {
              (anonymous_namespace)::Helper::GetRuntimeDestination_abi_cxx11_
                        (&local_1188,
                         &targets.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (cmInstallCommandArguments *)local_7b0);
              HandleImportedRuntimeArtifactsMode::anon_class_48_1_585e00ec::operator()
                        ((anon_class_48_1_585e00ec *)local_1168,(cmTarget *)&__range1_1,typeArgs,
                         (string *)local_7b0);
              std::
              unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,_std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>_>
              ::operator=(&frameworkGenerator,
                          (unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,_std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>_>
                           *)local_1168);
              std::
              unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,_std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>_>
              ::~unique_ptr((unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,_std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>_>
                             *)local_1168);
              std::__cxx11::string::~string((string *)&local_1188);
              uVar1 = system.field_2._8_8_;
              if (system.field_2._8_8_ != 0) {
                pcVar11 = std::
                          unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,_std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>_>
                          ::get(&frameworkGenerator);
                cmInstallRuntimeDependencySet::AddExecutable
                          ((cmInstallRuntimeDependencySet *)uVar1,pcVar11);
              }
              goto LAB_00618418;
            }
            cmInstallCommandArguments::GetDestination_abi_cxx11_
                      ((cmInstallCommandArguments *)local_b60);
            uVar8 = std::__cxx11::string::empty();
            uVar1 = helper.DefaultComponentName.field_2._8_8_;
            if ((uVar8 & 1) == 0) {
              cmInstallCommandArguments::GetDestination_abi_cxx11_
                        ((cmInstallCommandArguments *)local_b60);
              HandleImportedRuntimeArtifactsMode::anon_class_48_1_585e00ec::operator()
                        ((anon_class_48_1_585e00ec *)local_1158,(cmTarget *)&__range1_1,typeArgs,
                         (string *)local_b60);
              std::
              unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,_std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>_>
              ::operator=(&local_fd0,
                          (unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,_std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>_>
                           *)local_1158);
              std::
              unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,_std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>_>
              ::~unique_ptr((unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,_std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>_>
                             *)local_1158);
              uVar1 = system.field_2._8_8_;
              if (system.field_2._8_8_ != 0) {
                local_1168._8_8_ =
                     std::
                     unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,_std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>_>
                     ::get(&local_fd0);
                bVar3 = (anonymous_namespace)::
                        AddBundleExecutable<cmInstallImportedRuntimeArtifactsGenerator*>
                                  ((Helper *)
                                   &targets.
                                    super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (cmInstallRuntimeDependencySet *)uVar1,
                                   (cmInstallImportedRuntimeArtifactsGenerator **)(local_1168 + 8));
                if (((bVar3 ^ 0xffU) & 1) != 0) {
                  args_local._7_1_ = 0;
                  bVar3 = true;
                  goto LAB_006185fe;
                }
              }
              goto LAB_00618418;
            }
            cmAlphaNum::cmAlphaNum
                      (&local_1120,
                       "IMPORTED_RUNTIME_ARTIFACTS given no BUNDLE DESTINATION for MACOSX_BUNDLE executable target \""
                      );
            psVar9 = cmTarget::GetName_abi_cxx11_((cmTarget *)typeArgs);
            cmAlphaNum::cmAlphaNum((cmAlphaNum *)(local_1158 + 8),psVar9);
            cmStrCat<char[3]>(&local_10f0,&local_1120,(cmAlphaNum *)(local_1158 + 8),
                              (char (*) [3])0xd2b755);
            cmExecutionStatus::SetError((cmExecutionStatus *)uVar1,&local_10f0);
            std::__cxx11::string::~string((string *)&local_10f0);
            args_local._7_1_ = 0;
            bVar3 = true;
          }
          else {
            if (TVar5 == SHARED_LIBRARY) {
              bVar3 = cmTarget::IsDLLPlatform((cmTarget *)typeArgs);
              if (bVar3) {
                (anonymous_namespace)::Helper::GetRuntimeDestination_abi_cxx11_
                          (&local_ff8,
                           &targets.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (cmInstallCommandArguments *)local_7b0);
                HandleImportedRuntimeArtifactsMode::anon_class_48_1_585e00ec::operator()
                          ((anon_class_48_1_585e00ec *)local_fd8,(cmTarget *)&__range1_1,typeArgs,
                           (string *)local_7b0);
                std::
                unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,_std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>_>
                ::operator=(&frameworkGenerator,
                            (unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,_std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>_>
                             *)local_fd8);
                std::
                unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,_std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>_>
                ::~unique_ptr((unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,_std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>_>
                               *)local_fd8);
                std::__cxx11::string::~string((string *)&local_ff8);
                uVar1 = system.field_2._8_8_;
                if (system.field_2._8_8_ != 0) {
                  pcVar11 = std::
                            unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,_std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>_>
                            ::get(&frameworkGenerator);
                  cmInstallRuntimeDependencySet::AddLibrary
                            ((cmInstallRuntimeDependencySet *)uVar1,pcVar11);
                }
              }
              else {
                bVar3 = cmTarget::IsFrameworkOnApple((cmTarget *)typeArgs);
                if (bVar3) {
                  cmInstallCommandArguments::GetDestination_abi_cxx11_
                            ((cmInstallCommandArguments *)local_988);
                  uVar8 = std::__cxx11::string::empty();
                  uVar1 = helper.DefaultComponentName.field_2._8_8_;
                  if ((uVar8 & 1) != 0) {
                    cmAlphaNum::cmAlphaNum
                              (&local_1048,
                               "IMPORTED_RUNTIME_ARTIFACTS given no FRAMEWORK DESTINATION for shared library FRAMEWORK target \""
                              );
                    psVar9 = cmTarget::GetName_abi_cxx11_((cmTarget *)typeArgs);
                    cmAlphaNum::cmAlphaNum(&local_1078,psVar9);
                    cmStrCat<char[3]>(&local_1018,&local_1048,&local_1078,(char (*) [3])0xd2b755);
                    cmExecutionStatus::SetError((cmExecutionStatus *)uVar1,&local_1018);
                    std::__cxx11::string::~string((string *)&local_1018);
                    args_local._7_1_ = 0;
                    bVar3 = true;
                    goto LAB_006185fe;
                  }
                  cmInstallCommandArguments::GetDestination_abi_cxx11_
                            ((cmInstallCommandArguments *)local_988);
                  HandleImportedRuntimeArtifactsMode::anon_class_48_1_585e00ec::operator()
                            ((anon_class_48_1_585e00ec *)(local_1088 + 8),(cmTarget *)&__range1_1,
                             typeArgs,(string *)local_988);
                  std::
                  unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,_std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>_>
                  ::operator=(&bundleGenerator,
                              (unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,_std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>_>
                               *)(local_1088 + 8));
                  std::
                  unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,_std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>_>
                  ::~unique_ptr((unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,_std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>_>
                                 *)(local_1088 + 8));
                  uVar1 = system.field_2._8_8_;
                  if (system.field_2._8_8_ != 0) {
                    pcVar11 = std::
                              unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,_std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>_>
                              ::get(&bundleGenerator);
                    cmInstallRuntimeDependencySet::AddLibrary
                              ((cmInstallRuntimeDependencySet *)uVar1,pcVar11);
                  }
                }
                else {
                  (anonymous_namespace)::Helper::GetLibraryDestination_abi_cxx11_
                            ((string *)(local_10b0 + 8),
                             &targets.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                             (cmInstallCommandArguments *)local_5d8);
                  HandleImportedRuntimeArtifactsMode::anon_class_48_1_585e00ec::operator()
                            ((anon_class_48_1_585e00ec *)local_1088,(cmTarget *)&__range1_1,typeArgs
                             ,(string *)local_5d8);
                  std::
                  unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,_std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>_>
                  ::operator=(&runtimeGenerator,
                              (unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,_std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>_>
                               *)local_1088);
                  std::
                  unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,_std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>_>
                  ::~unique_ptr((unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,_std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>_>
                                 *)local_1088);
                  std::__cxx11::string::~string((string *)(local_10b0 + 8));
                  uVar1 = system.field_2._8_8_;
                  if (system.field_2._8_8_ != 0) {
                    pcVar11 = std::
                              unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,_std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>_>
                              ::get(&runtimeGenerator);
                    cmInstallRuntimeDependencySet::AddLibrary
                              ((cmInstallRuntimeDependencySet *)uVar1,pcVar11);
                  }
                }
              }
            }
            else {
              if (TVar5 != MODULE_LIBRARY) {
                __assert_fail("false && \"This should never happen\"",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmInstallCommand.cxx"
                              ,0x5bc,
                              "bool (anonymous namespace)::HandleImportedRuntimeArtifactsMode(const std::vector<std::string> &, cmExecutionStatus &)"
                             );
              }
              (anonymous_namespace)::Helper::GetLibraryDestination_abi_cxx11_
                        (&local_10d0,
                         &targets.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (cmInstallCommandArguments *)local_5d8);
              HandleImportedRuntimeArtifactsMode::anon_class_48_1_585e00ec::operator()
                        ((anon_class_48_1_585e00ec *)local_10b0,(cmTarget *)&__range1_1,typeArgs,
                         (string *)local_5d8);
              std::
              unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,_std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>_>
              ::operator=(&runtimeGenerator,
                          (unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,_std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>_>
                           *)local_10b0);
              std::
              unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,_std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>_>
              ::~unique_ptr((unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,_std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>_>
                             *)local_10b0);
              std::__cxx11::string::~string((string *)&local_10d0);
              uVar1 = system.field_2._8_8_;
              if (system.field_2._8_8_ != 0) {
                pcVar11 = std::
                          unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,_std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>_>
                          ::get(&runtimeGenerator);
                cmInstallRuntimeDependencySet::AddModule
                          ((cmInstallRuntimeDependencySet *)uVar1,pcVar11);
              }
            }
LAB_00618418:
            local_1399 = true;
            if ((createInstallGenerator.helper.DefaultComponentName.field_2._M_local_buf[0xf] & 1U)
                == 0) {
              local_1399 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&runtimeGenerator);
            }
            createInstallGenerator.helper.DefaultComponentName.field_2._M_local_buf[0xf] =
                 local_1399;
            local_139a = true;
            if ((createInstallGenerator.helper.DefaultComponentName.field_2._M_local_buf[0xe] & 1U)
                == 0) {
              local_139a = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&frameworkGenerator)
              ;
            }
            createInstallGenerator.helper.DefaultComponentName.field_2._M_local_buf[0xe] =
                 local_139a;
            local_139b = true;
            if ((createInstallGenerator.helper.DefaultComponentName.field_2._M_local_buf[0xd] & 1U)
                == 0) {
              local_139b = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&bundleGenerator);
            }
            createInstallGenerator.helper.DefaultComponentName.field_2._M_local_buf[0xd] =
                 local_139b;
            local_139c = true;
            if ((createInstallGenerator.helper.DefaultComponentName.field_2._M_local_buf[0xc] & 1U)
                == 0) {
              local_139c = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_fd0);
            }
            pcVar2 = helper.Status;
            createInstallGenerator.helper.DefaultComponentName.field_2._M_local_buf[0xc] =
                 local_139c;
            std::unique_ptr<cmInstallGenerator,std::default_delete<cmInstallGenerator>>::
            unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>,void>
                      ((unique_ptr<cmInstallGenerator,std::default_delete<cmInstallGenerator>> *)
                       &local_1190,&runtimeGenerator);
            cmMakefile::AddInstallGenerator((cmMakefile *)pcVar2,&local_1190);
            std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>::
            ~unique_ptr(&local_1190);
            pcVar2 = helper.Status;
            std::unique_ptr<cmInstallGenerator,std::default_delete<cmInstallGenerator>>::
            unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>,void>
                      ((unique_ptr<cmInstallGenerator,std::default_delete<cmInstallGenerator>> *)
                       &local_1198,&frameworkGenerator);
            cmMakefile::AddInstallGenerator((cmMakefile *)pcVar2,&local_1198);
            std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>::
            ~unique_ptr(&local_1198);
            pcVar2 = helper.Status;
            std::unique_ptr<cmInstallGenerator,std::default_delete<cmInstallGenerator>>::
            unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>,void>
                      ((unique_ptr<cmInstallGenerator,std::default_delete<cmInstallGenerator>> *)
                       &local_11a0,&bundleGenerator);
            cmMakefile::AddInstallGenerator((cmMakefile *)pcVar2,&local_11a0);
            std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>::
            ~unique_ptr(&local_11a0);
            pcVar2 = helper.Status;
            std::unique_ptr<cmInstallGenerator,std::default_delete<cmInstallGenerator>>::
            unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>,void>
                      ((unique_ptr<cmInstallGenerator,std::default_delete<cmInstallGenerator>> *)
                       &local_11a8,&local_fd0);
            cmMakefile::AddInstallGenerator((cmMakefile *)pcVar2,&local_11a8);
            std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>::
            ~unique_ptr(&local_11a8);
            bVar3 = false;
          }
LAB_006185fe:
          std::
          unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,_std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>_>
          ::~unique_ptr(&local_fd0);
          std::
          unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,_std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>_>
          ::~unique_ptr(&bundleGenerator);
          std::
          unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,_std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>_>
          ::~unique_ptr(&frameworkGenerator);
          std::
          unique_ptr<cmInstallImportedRuntimeArtifactsGenerator,_std::default_delete<cmInstallImportedRuntimeArtifactsGenerator>_>
          ::~unique_ptr(&runtimeGenerator);
          if (bVar3) goto LAB_00618845;
          __gnu_cxx::
          __normal_iterator<cmTarget_**,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_>::
          operator++(&__end1_1);
        }
        if ((createInstallGenerator.helper.DefaultComponentName.field_2._M_local_buf[0xf] & 1U) != 0
           ) {
          pcVar12 = cmMakefile::GetGlobalGenerator((cmMakefile *)helper.Status);
          psVar9 = cmInstallCommandArguments::GetComponent_abi_cxx11_
                             ((cmInstallCommandArguments *)local_5d8);
          cmGlobalGenerator::AddInstallComponent(pcVar12,psVar9);
        }
        if ((createInstallGenerator.helper.DefaultComponentName.field_2._M_local_buf[0xe] & 1U) != 0
           ) {
          pcVar12 = cmMakefile::GetGlobalGenerator((cmMakefile *)helper.Status);
          psVar9 = cmInstallCommandArguments::GetComponent_abi_cxx11_
                             ((cmInstallCommandArguments *)local_7b0);
          cmGlobalGenerator::AddInstallComponent(pcVar12,psVar9);
        }
        if ((createInstallGenerator.helper.DefaultComponentName.field_2._M_local_buf[0xd] & 1U) != 0
           ) {
          pcVar12 = cmMakefile::GetGlobalGenerator((cmMakefile *)helper.Status);
          psVar9 = cmInstallCommandArguments::GetComponent_abi_cxx11_
                             ((cmInstallCommandArguments *)local_988);
          cmGlobalGenerator::AddInstallComponent(pcVar12,psVar9);
        }
        if ((createInstallGenerator.helper.DefaultComponentName.field_2._M_local_buf[0xc] & 1U) != 0
           ) {
          pcVar12 = cmMakefile::GetGlobalGenerator((cmMakefile *)helper.Status);
          psVar9 = cmInstallCommandArguments::GetComponent_abi_cxx11_
                             ((cmInstallCommandArguments *)local_b60);
          cmGlobalGenerator::AddInstallComponent(pcVar12,psVar9);
        }
        args_local._7_1_ = 1;
LAB_00618845:
        (anonymous_namespace)::
        HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
        ::$_0::~__0((__0 *)&__range1_1);
      }
    }
  }
  else {
    cmAlphaNum::cmAlphaNum(&local_c90,"IMPORTED_RUNTIME_ARTIFACTS given unknown argument \"");
    str = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)((long)&genericArgs.DefaultComponentName.field_2 + 8),0);
    cmAlphaNum::cmAlphaNum(&local_cc0,str);
    cmStrCat<char[3]>(&local_c60,&local_c90,&local_cc0,(char (*) [3])0xd2b755);
    cmExecutionStatus::SetError((cmExecutionStatus *)uVar1,&local_c60);
    std::__cxx11::string::~string((string *)&local_c60);
    args_local._7_1_ = 0;
  }
LAB_00618864:
  cmInstallCommandArguments::~cmInstallCommandArguments((cmInstallCommandArguments *)local_b60);
  cmInstallCommandArguments::~cmInstallCommandArguments((cmInstallCommandArguments *)local_988);
  cmInstallCommandArguments::~cmInstallCommandArguments((cmInstallCommandArguments *)local_7b0);
  cmInstallCommandArguments::~cmInstallCommandArguments((cmInstallCommandArguments *)local_5d8);
  cmInstallCommandArguments::~cmInstallCommandArguments((cmInstallCommandArguments *)local_3a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&genericArgs.DefaultComponentName.field_2 + 8));
  std::__cxx11::string::~string
            ((string *)
             &unknownArgs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ArgumentParser::
  MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~MaybeEmpty((MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)((long)&runtimeDependencySetArg.field_2 + 8));
  HandleImportedRuntimeArtifactsMode::ArgVectors::~ArgVectors
            ((ArgVectors *)
             &targetList.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&argVectors.Bundle.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::~vector
            ((vector<cmTarget_*,_std::allocator<cmTarget_*>_> *)local_68);
  Helper::~Helper((Helper *)
                  &targets.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleImportedRuntimeArtifactsMode(std::vector<std::string> const& args,
                                        cmExecutionStatus& status)
{
  Helper helper(status);

  // This is the IMPORTED_RUNTIME_ARTIFACTS mode.
  std::vector<cmTarget*> targets;

  struct ArgVectors
  {
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Library;
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Runtime;
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Framework;
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Bundle;
  };

  static auto const argHelper = cmArgumentParser<ArgVectors>{}
                                  .Bind("LIBRARY"_s, &ArgVectors::Library)
                                  .Bind("RUNTIME"_s, &ArgVectors::Runtime)
                                  .Bind("FRAMEWORK"_s, &ArgVectors::Framework)
                                  .Bind("BUNDLE"_s, &ArgVectors::Bundle);

  std::vector<std::string> genericArgVector;
  ArgVectors const argVectors = argHelper.Parse(args, &genericArgVector);

  // now parse the generic args (i.e. the ones not specialized on LIBRARY,
  // RUNTIME etc. (see above)
  ArgumentParser::MaybeEmpty<std::vector<std::string>> targetList;
  std::string runtimeDependencySetArg;
  std::vector<std::string> unknownArgs;
  cmInstallCommandArguments genericArgs(helper.DefaultComponentName);
  genericArgs.Bind("IMPORTED_RUNTIME_ARTIFACTS"_s, targetList)
    .Bind("RUNTIME_DEPENDENCY_SET"_s, runtimeDependencySetArg);
  genericArgs.Parse(genericArgVector, &unknownArgs);
  bool success = genericArgs.Finalize();

  cmInstallCommandArguments libraryArgs(helper.DefaultComponentName);
  cmInstallCommandArguments runtimeArgs(helper.DefaultComponentName);
  cmInstallCommandArguments frameworkArgs(helper.DefaultComponentName);
  cmInstallCommandArguments bundleArgs(helper.DefaultComponentName);

  // now parse the args for specific parts of the target (e.g. LIBRARY,
  // RUNTIME etc.
  libraryArgs.Parse(argVectors.Library, &unknownArgs);
  runtimeArgs.Parse(argVectors.Runtime, &unknownArgs);
  frameworkArgs.Parse(argVectors.Framework, &unknownArgs);
  bundleArgs.Parse(argVectors.Bundle, &unknownArgs);

  if (!unknownArgs.empty()) {
    // Unknown argument.
    status.SetError(
      cmStrCat("IMPORTED_RUNTIME_ARTIFACTS given unknown argument \"",
               unknownArgs[0], "\"."));
    return false;
  }

  // apply generic args
  libraryArgs.SetGenericArguments(&genericArgs);
  runtimeArgs.SetGenericArguments(&genericArgs);
  frameworkArgs.SetGenericArguments(&genericArgs);
  bundleArgs.SetGenericArguments(&genericArgs);

  success = success && libraryArgs.Finalize();
  success = success && runtimeArgs.Finalize();
  success = success && frameworkArgs.Finalize();
  success = success && bundleArgs.Finalize();

  if (!success) {
    return false;
  }

  cmInstallRuntimeDependencySet* runtimeDependencySet = nullptr;
  if (!runtimeDependencySetArg.empty()) {
    auto system = helper.Makefile->GetSafeDefinition("CMAKE_HOST_SYSTEM_NAME");
    if (!cmRuntimeDependencyArchive::PlatformSupportsRuntimeDependencies(
          system)) {
      status.SetError(
        cmStrCat("IMPORTED_RUNTIME_ARTIFACTS RUNTIME_DEPENDENCY_SET is not "
                 "supported on system \"",
                 system, '"'));
      return false;
    }
    runtimeDependencySet =
      helper.Makefile->GetGlobalGenerator()->GetNamedRuntimeDependencySet(
        runtimeDependencySetArg);
  }

  // Check if there is something to do.
  if (targetList.empty()) {
    return true;
  }

  for (std::string const& tgt : targetList) {
    if (helper.Makefile->IsAlias(tgt)) {
      status.SetError(cmStrCat("IMPORTED_RUNTIME_ARTIFACTS given target \"",
                               tgt, "\" which is an alias."));
      return false;
    }
    // Lookup this target in the current directory.
    cmTarget* target = helper.Makefile->FindTargetToUse(tgt);
    if (!target || !target->IsImported()) {
      // If no local target has been found, find it in the global scope.
      cmTarget* const global_target =
        helper.Makefile->GetGlobalGenerator()->FindTarget(tgt, true);
      if (global_target && global_target->IsImported()) {
        target = global_target;
      }
    }
    if (target) {
      // Found the target.  Check its type.
      if (target->GetType() != cmStateEnums::EXECUTABLE &&
          target->GetType() != cmStateEnums::SHARED_LIBRARY &&
          target->GetType() != cmStateEnums::MODULE_LIBRARY) {
        status.SetError(
          cmStrCat("IMPORTED_RUNTIME_ARTIFACTS given target \"", tgt,
                   "\" which is not an executable, library, or module."));
        return false;
      }
      // Store the target in the list to be installed.
      targets.push_back(target);
    } else {
      // Did not find the target.
      status.SetError(cmStrCat("IMPORTED_RUNTIME_ARTIFACTS given target \"",
                               tgt, "\" which does not exist."));
      return false;
    }
  }

  // Keep track of whether we will be performing an installation of
  // any files of the given type.
  bool installsLibrary = false;
  bool installsRuntime = false;
  bool installsFramework = false;
  bool installsBundle = false;

  auto const createInstallGenerator =
    [helper](cmTarget& target, const cmInstallCommandArguments& typeArgs,
             const std::string& destination)
    -> std::unique_ptr<cmInstallImportedRuntimeArtifactsGenerator> {
    return cm::make_unique<cmInstallImportedRuntimeArtifactsGenerator>(
      target.GetName(), destination, typeArgs.GetPermissions(),
      typeArgs.GetConfigurations(), typeArgs.GetComponent(),
      cmInstallGenerator::SelectMessageLevel(helper.Makefile),
      typeArgs.GetExcludeFromAll(), typeArgs.GetOptional(),
      helper.Makefile->GetBacktrace());
  };

  // Generate install script code to install the given targets.
  for (cmTarget* ti : targets) {
    // Handle each target type.
    cmTarget& target = *ti;
    std::unique_ptr<cmInstallImportedRuntimeArtifactsGenerator>
      libraryGenerator;
    std::unique_ptr<cmInstallImportedRuntimeArtifactsGenerator>
      runtimeGenerator;
    std::unique_ptr<cmInstallImportedRuntimeArtifactsGenerator>
      frameworkGenerator;
    std::unique_ptr<cmInstallImportedRuntimeArtifactsGenerator>
      bundleGenerator;

    switch (target.GetType()) {
      case cmStateEnums::SHARED_LIBRARY:
        if (target.IsDLLPlatform()) {
          runtimeGenerator = createInstallGenerator(
            target, runtimeArgs, helper.GetRuntimeDestination(&runtimeArgs));
          if (runtimeDependencySet) {
            runtimeDependencySet->AddLibrary(runtimeGenerator.get());
          }
        } else if (target.IsFrameworkOnApple()) {
          if (frameworkArgs.GetDestination().empty()) {
            status.SetError(cmStrCat("IMPORTED_RUNTIME_ARTIFACTS given no "
                                     "FRAMEWORK DESTINATION for shared "
                                     "library FRAMEWORK target \"",
                                     target.GetName(), "\"."));
            return false;
          }
          frameworkGenerator = createInstallGenerator(
            target, frameworkArgs, frameworkArgs.GetDestination());
          if (runtimeDependencySet) {
            runtimeDependencySet->AddLibrary(frameworkGenerator.get());
          }
        } else {
          libraryGenerator = createInstallGenerator(
            target, libraryArgs, helper.GetLibraryDestination(&libraryArgs));
          if (runtimeDependencySet) {
            runtimeDependencySet->AddLibrary(libraryGenerator.get());
          }
        }
        break;
      case cmStateEnums::MODULE_LIBRARY:
        libraryGenerator = createInstallGenerator(
          target, libraryArgs, helper.GetLibraryDestination(&libraryArgs));
        if (runtimeDependencySet) {
          runtimeDependencySet->AddModule(libraryGenerator.get());
        }
        break;
      case cmStateEnums::EXECUTABLE:
        if (target.IsAppBundleOnApple()) {
          if (bundleArgs.GetDestination().empty()) {
            status.SetError(
              cmStrCat("IMPORTED_RUNTIME_ARTIFACTS given no BUNDLE "
                       "DESTINATION for MACOSX_BUNDLE executable target \"",
                       target.GetName(), "\"."));
            return false;
          }
          bundleGenerator = createInstallGenerator(
            target, bundleArgs, bundleArgs.GetDestination());
          if (runtimeDependencySet) {
            if (!AddBundleExecutable(helper, runtimeDependencySet,
                                     bundleGenerator.get())) {
              return false;
            }
          }
        } else {
          runtimeGenerator = createInstallGenerator(
            target, runtimeArgs, helper.GetRuntimeDestination(&runtimeArgs));
          if (runtimeDependencySet) {
            runtimeDependencySet->AddExecutable(runtimeGenerator.get());
          }
        }
        break;
      default:
        assert(false && "This should never happen");
        break;
    }

    // Keep track of whether we're installing anything in each category
    installsLibrary = installsLibrary || libraryGenerator;
    installsRuntime = installsRuntime || runtimeGenerator;
    installsFramework = installsFramework || frameworkGenerator;
    installsBundle = installsBundle || bundleGenerator;

    helper.Makefile->AddInstallGenerator(std::move(libraryGenerator));
    helper.Makefile->AddInstallGenerator(std::move(runtimeGenerator));
    helper.Makefile->AddInstallGenerator(std::move(frameworkGenerator));
    helper.Makefile->AddInstallGenerator(std::move(bundleGenerator));
  }

  // Tell the global generator about any installation component names
  // specified
  if (installsLibrary) {
    helper.Makefile->GetGlobalGenerator()->AddInstallComponent(
      libraryArgs.GetComponent());
  }
  if (installsRuntime) {
    helper.Makefile->GetGlobalGenerator()->AddInstallComponent(
      runtimeArgs.GetComponent());
  }
  if (installsFramework) {
    helper.Makefile->GetGlobalGenerator()->AddInstallComponent(
      frameworkArgs.GetComponent());
  }
  if (installsBundle) {
    helper.Makefile->GetGlobalGenerator()->AddInstallComponent(
      bundleArgs.GetComponent());
  }

  return true;
}